

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O0

void testEncoding(void)

{
  RootRecord *this;
  element_type *peVar1;
  type pEVar2;
  RootRecord *t;
  element_type *peVar3;
  RootRecord t2;
  auto_ptr<avro::InputStream> is;
  DecoderPtr d;
  RootRecord t1;
  EncoderPtr e;
  auto_ptr<avro::OutputStream> os;
  ifstream ifs;
  ValidSchema s;
  RootRecord *in_stack_00000628;
  RootRecord *in_stack_00000630;
  RootRecord *in_stack_fffffffffffffaf8;
  RootRecord *in_stack_fffffffffffffb60;
  OutputStream local_3b8 [24];
  shared_ptr<avro::Decoder> local_3a0 [3];
  RootRecord *in_stack_fffffffffffffc90;
  shared_ptr<avro::Encoder> local_240;
  auto_ptr<avro::OutputStream> local_230 [24];
  istream local_218 [520];
  ValidSchema local_10 [16];
  
  avro::ValidSchema::ValidSchema(local_10);
  std::ifstream::ifstream(local_218,"jsonschemas/bigrecord",_S_in);
  avro::compileJsonSchema(local_218,local_10);
  avro::memoryOutputStream((ulong)local_230);
  avro::binaryEncoder();
  avro::validatingEncoder((ValidSchema *)&local_240,(shared_ptr *)local_10);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x2325d5);
  this = (RootRecord *)boost::shared_ptr<avro::Encoder>::operator->(&local_240);
  peVar1 = std::auto_ptr<avro::OutputStream>::operator*(local_230);
  (**(code **)(this->mylong + 0x10))(this,peVar1);
  testgen::RootRecord::RootRecord(in_stack_fffffffffffffb60);
  setRecord(in_stack_fffffffffffffc90);
  boost::shared_ptr<avro::Encoder>::operator*(&local_240);
  avro::encode<testgen::RootRecord>((Encoder *)this,in_stack_fffffffffffffaf8);
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(&local_240);
  (**(code **)(*(long *)pEVar2 + 0x18))();
  avro::binaryDecoder();
  avro::validatingDecoder((ValidSchema *)local_3a0,(shared_ptr *)local_10);
  boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x23269a);
  std::auto_ptr<avro::OutputStream>::operator*(local_230);
  avro::memoryInputStream(local_3b8);
  t = (RootRecord *)boost::shared_ptr<avro::Decoder>::operator->(local_3a0);
  peVar3 = std::auto_ptr<avro::InputStream>::operator*((auto_ptr<avro::InputStream> *)local_3b8);
  (**(code **)(t->mylong + 0x10))(t,peVar3);
  testgen::RootRecord::RootRecord(in_stack_fffffffffffffb60);
  boost::shared_ptr<avro::Decoder>::operator*(local_3a0);
  avro::decode<testgen::RootRecord>((Decoder *)this,t);
  checkRecord<testgen::RootRecord,testgen::RootRecord>(in_stack_00000630,in_stack_00000628);
  testgen::RootRecord::~RootRecord(this);
  std::auto_ptr<avro::InputStream>::~auto_ptr((auto_ptr<avro::InputStream> *)this);
  boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x232749);
  testgen::RootRecord::~RootRecord(this);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x232763);
  std::auto_ptr<avro::OutputStream>::~auto_ptr((auto_ptr<avro::OutputStream> *)this);
  std::ifstream::~ifstream(local_218);
  avro::ValidSchema::~ValidSchema((ValidSchema *)0x23278a);
  return;
}

Assistant:

void testEncoding()
{
    ValidSchema s;
    ifstream ifs("jsonschemas/bigrecord");
    compileJsonSchema(ifs, s);
    auto_ptr<OutputStream> os = memoryOutputStream();
    EncoderPtr e = validatingEncoder(s, binaryEncoder());
    e->init(*os);
    testgen::RootRecord t1;
    setRecord(t1);
    avro::encode(*e, t1);
    e->flush();

    DecoderPtr d = validatingDecoder(s, binaryDecoder());
    auto_ptr<InputStream> is = memoryInputStream(*os);
    d->init(*is);
    testgen::RootRecord t2;
    avro::decode(*d, t2);

    checkRecord(t2, t1);
}